

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyDescriptor.cpp
# Opt level: O0

PropertyAttributes __thiscall Js::PropertyDescriptor::GetAttributes(PropertyDescriptor *this)

{
  byte local_11;
  PropertyAttributes attributes;
  PropertyDescriptor *this_local;
  
  local_11 = 0;
  if (((this->configurableSpecified & 1U) != 0) && ((this->Configurable & 1U) != 0)) {
    local_11 = 2;
  }
  if (((this->enumerableSpecified & 1U) != 0) && ((this->Enumerable & 1U) != 0)) {
    local_11 = local_11 | 1;
  }
  if (((this->writableSpecified & 1U) != 0) && ((this->Writable & 1U) != 0)) {
    local_11 = local_11 | 4;
  }
  return local_11;
}

Assistant:

PropertyAttributes PropertyDescriptor::GetAttributes() const
    {
        PropertyAttributes attributes = PropertyNone;

        if (this->configurableSpecified && this->Configurable)
        {
            attributes |= PropertyConfigurable;
        }
        if (this->enumerableSpecified && this->Enumerable)
        {
            attributes |= PropertyEnumerable;
        }
        if (this->writableSpecified && this->Writable)
        {
            attributes |= PropertyWritable;
        }

        return attributes;
    }